

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

int xmlListAppend(xmlListPtr l,void *data)

{
  xmlGenericErrorFunc p_Var1;
  xmlLinkPtr pxVar2;
  _xmlLink *p_Var3;
  xmlGenericErrorFunc *pp_Var4;
  void **ppvVar5;
  xmlLinkPtr lkNew;
  xmlLinkPtr lkPlace;
  void *data_local;
  xmlListPtr l_local;
  
  if (l == (xmlListPtr)0x0) {
    l_local._4_4_ = 1;
  }
  else {
    pxVar2 = xmlListHigherSearch(l,data);
    p_Var3 = (_xmlLink *)(*xmlMalloc)(0x18);
    if (p_Var3 == (_xmlLink *)0x0) {
      pp_Var4 = __xmlGenericError();
      p_Var1 = *pp_Var4;
      ppvVar5 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar5,"Cannot initialize memory for new link");
      l_local._4_4_ = 1;
    }
    else {
      p_Var3->data = data;
      p_Var3->next = pxVar2->next;
      pxVar2->next->prev = p_Var3;
      pxVar2->next = p_Var3;
      p_Var3->prev = pxVar2;
      l_local._4_4_ = 0;
    }
  }
  return l_local._4_4_;
}

Assistant:

int xmlListAppend(xmlListPtr l, void *data)
{
    xmlLinkPtr lkPlace, lkNew;

    if (l == NULL)
        return(1);
    lkPlace = xmlListHigherSearch(l, data);
    /* Add the new link */
    lkNew = (xmlLinkPtr) xmlMalloc(sizeof(xmlLink));
    if (lkNew == NULL) {
        xmlGenericError(xmlGenericErrorContext,
		        "Cannot initialize memory for new link");
        return (1);
    }
    lkNew->data = data;
    lkNew->next = lkPlace->next;
    (lkPlace->next)->prev = lkNew;
    lkPlace->next = lkNew;
    lkNew->prev = lkPlace;
    return 0;
}